

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

NFAState * new_NFAState(LexState *ls)

{
  NFAState **ppNVar1;
  uint uVar2;
  uint uVar3;
  NFAState **ppNVar4;
  NFAState *elem;
  VecNFAState *v;
  
  elem = (NFAState *)calloc(1,0x2880);
  uVar2 = ls->nfa_index;
  ls->nfa_index = uVar2 + 1;
  elem->index = uVar2;
  ppNVar4 = (ls->allnfas).v;
  ppNVar1 = (ls->allnfas).e;
  if (ppNVar4 == (NFAState **)0x0) {
    (ls->allnfas).v = ppNVar1;
    uVar3 = (ls->allnfas).n;
    (ls->allnfas).n = uVar3 + 1;
    (ls->allnfas).e[uVar3] = elem;
    return elem;
  }
  v = &ls->allnfas;
  uVar3 = v->n;
  if (ppNVar4 == ppNVar1) {
    if (2 < uVar3) goto LAB_0013f2c2;
  }
  else if ((uVar3 & 7) == 0) {
LAB_0013f2c2:
    vec_add_internal(v,elem);
    return elem;
  }
  v->n = uVar3 + 1;
  ppNVar4[uVar3] = elem;
  return elem;
}

Assistant:

static NFAState *new_NFAState(LexState *ls) {
  NFAState *n = MALLOC(sizeof(NFAState));
  memset(n, 0, sizeof(NFAState));
  n->index = ls->nfa_index++;
  vec_add(&ls->allnfas, n);
  return n;
}